

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::Flatten
          (MessageGenerator *this,
          vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
          *list)

{
  int iVar1;
  int iVar2;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  size_type sVar3;
  MessageGenerator *local_28;
  int local_1c;
  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  *pvStack_18;
  int i;
  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  *list_local;
  MessageGenerator *this_local;
  
  local_1c = 0;
  pvStack_18 = list;
  list_local = (vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
                *)this;
  while( true ) {
    iVar1 = local_1c;
    iVar2 = Descriptor::nested_type_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator[](&this->nested_generators_,(long)local_1c);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                        (this_00);
    Flatten(this_01,pvStack_18);
    local_1c = local_1c + 1;
  }
  sVar3 = std::
          vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
          ::size(pvStack_18);
  this->index_in_file_messages_ = (int)sVar3;
  local_28 = this;
  std::
  vector<google::protobuf::compiler::cpp::MessageGenerator_*,_std::allocator<google::protobuf::compiler::cpp::MessageGenerator_*>_>
  ::push_back(pvStack_18,&local_28);
  return;
}

Assistant:

void MessageGenerator::Flatten(std::vector<MessageGenerator*>* list) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->Flatten(list);
  }
  index_in_file_messages_ = list->size();
  list->push_back(this);
}